

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall mp::internal::SignalHandler::~SignalHandler(SignalHandler *this)

{
  ~SignalHandler(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

SignalHandler::~SignalHandler() {
  solver_.set_interrupter(0);
  stop_ = 1;
  handler_ = 0;
  signal_message_size_ = 0;
}